

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySingleValue::IfcPropertySingleValue
          (IfcPropertySingleValue *this)

{
  *(undefined ***)&this->field_0xa8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xb0 = 0;
  *(char **)&this->field_0xb8 = "IfcPropertySingleValue";
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__007b7848);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7b77b8;
  *(undefined8 *)&this->field_0xa8 = 0x7b7830;
  *(undefined8 *)&this->field_0x58 = 0x7b77e0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x7b7808;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).field_0x20 = 0;
  (this->Unit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Unit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Unit).have = false;
  return;
}

Assistant:

IfcPropertySingleValue() : Object("IfcPropertySingleValue") {}